

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O3

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  
  bVar1 = *mode;
  if (bVar1 == 0) {
    uVar3 = 10;
  }
  else {
    uVar3 = 10;
    do {
      mode = (char *)((byte *)mode + 1);
      uVar2 = (uint)bVar1;
      if ((bVar1 == 0x66) || (uVar2 == 0x6c)) {
        *(uint *)((ulong)(L->glref).ptr32 + 0xc64) = uVar2;
        lj_trace_flushall(L);
      }
      else if (uVar2 == 0x69) {
        bVar1 = *mode;
        uVar3 = 0;
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar3 = 0;
          do {
            uVar3 = (uint)(byte)(bVar1 - 0x30) + uVar3 * 10;
            bVar1 = ((byte *)mode)[1];
            mode = (char *)((byte *)mode + 1);
          } while ((byte)(bVar1 - 0x30) < 10);
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
      }
      bVar1 = *mode;
    } while (bVar1 != 0);
  }
  if ((profile_state.g != (global_State *)0x0) &&
     (luaJIT_profile_stop(L), profile_state.g != (global_State *)0x0)) {
    return;
  }
  profile_state.g = (global_State *)(ulong)(L->glref).ptr32;
  profile_state.samples = 0;
  profile_state.sb.L.ptr32 = (uint32_t)L;
  profile_state.sb.p.ptr32 = 0;
  profile_state.sb.e.ptr32 = 0;
  profile_state.sb.b.ptr32 = 0;
  profile_state.timer.opt.handler = profile_handler;
  profile_state.cb = cb;
  profile_state.data = data;
  profile_state.timer.opt.interval_msec = uVar3;
  lj_profile_timer_start(&profile_state.timer);
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  ps->timer.opt.interval_msec = interval;
  ps->timer.opt.handler = profile_handler;
  lj_profile_timer_start(&ps->timer);
}